

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O3

ON_3dPoint * __thiscall
ON_SubDVertex::Point
          (ON_3dPoint *__return_storage_ptr__,ON_SubDVertex *this,
          ON_SubDComponentLocation point_location)

{
  double dVar1;
  bool bVar2;
  undefined3 in_register_00000011;
  int iVar3;
  ON_3dPoint *pOVar4;
  ON_3dPoint limit_point;
  ON_3dPoint local_38;
  
  iVar3 = CONCAT31(in_register_00000011,point_location);
  if (iVar3 != 0) {
    if (iVar3 == 2) {
      local_38.z = ON_3dPoint::NanPoint.z;
      local_38.x = ON_3dPoint::NanPoint.x;
      local_38.y = ON_3dPoint::NanPoint.y;
      bVar2 = GetSurfacePoint(this,&local_38.x);
      pOVar4 = &ON_3dPoint::NanPoint;
      if (bVar2) {
        pOVar4 = &local_38;
      }
      dVar1 = pOVar4->y;
      __return_storage_ptr__->x = pOVar4->x;
      __return_storage_ptr__->y = dVar1;
      __return_storage_ptr__->z = pOVar4->z;
      return __return_storage_ptr__;
    }
    if (iVar3 == 1) {
      ControlNetPoint(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  dVar1 = ON_3dPoint::NanPoint.y;
  __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
  __return_storage_ptr__->y = dVar1;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDVertex::Point(ON_SubDComponentLocation point_location) const
{
  switch (point_location)
  {
  case ON_SubDComponentLocation::ControlNet:
    return this->ControlNetPoint();
    break;
  case ON_SubDComponentLocation::Surface:
    return this->SurfacePoint();
    break;
  case ON_SubDComponentLocation::Unset:
    return ON_3dPoint::NanPoint;
    break;
  }
  return ON_3dPoint::NanPoint;
}